

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O2

void at_plus_a(int n,int_t nz,int_t *colptr,int_t *rowind,int_t *bnz,int_t **b_colptr,
              int_t **b_rowind)

{
  int *piVar1;
  size_t size;
  int iVar2;
  undefined4 uVar3;
  void *addr;
  undefined4 *addr_00;
  void *addr_01;
  ulong uVar4;
  ulong uVar5;
  int_t *piVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  char msg [256];
  char local_138 [264];
  
  lVar11 = (long)n;
  addr = superlu_malloc(lVar11 * 4);
  if (addr == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0x123,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  size = lVar11 * 4 + 4;
  addr_00 = (undefined4 *)superlu_malloc(size);
  if (addr_00 == (undefined4 *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_colptr[]",0x125,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  addr_01 = superlu_malloc((long)nz << 2);
  if (addr_01 == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails t_rowind[]",0x127,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  uVar4 = 0;
  uVar10 = (ulong)(uint)n;
  if (n < 1) {
    uVar10 = uVar4;
  }
  for (; uVar10 != uVar4; uVar4 = uVar4 + 1) {
    *(undefined4 *)((long)addr + uVar4 * 4) = 0;
  }
  uVar4 = 0;
  while (uVar4 != uVar10) {
    piVar1 = colptr + uVar4;
    uVar4 = uVar4 + 1;
    for (lVar8 = (long)*piVar1; lVar8 < colptr[uVar4]; lVar8 = lVar8 + 1) {
      piVar1 = (int *)((long)addr + (long)rowind[lVar8] * 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  *addr_00 = 0;
  for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
    addr_00[uVar4 + 1] = *(int *)((long)addr + uVar4 * 4) + addr_00[uVar4];
    *(undefined4 *)((long)addr + uVar4 * 4) = addr_00[uVar4];
  }
  uVar4 = 0;
  while (uVar5 = uVar4, uVar5 != uVar10) {
    for (lVar8 = (long)colptr[uVar5]; uVar4 = uVar5 + 1, lVar8 < colptr[uVar5 + 1];
        lVar8 = lVar8 + 1) {
      iVar7 = rowind[lVar8];
      *(int *)((long)addr_01 + (long)*(int *)((long)addr + (long)iVar7 * 4) * 4) = (int)uVar5;
      piVar1 = (int *)((long)addr + (long)iVar7 * 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
    *(undefined4 *)((long)addr + uVar4 * 4) = 0xffffffff;
  }
  iVar7 = 0;
  uVar4 = 0;
  while (uVar5 = uVar4, uVar5 != uVar10) {
    uVar3 = (undefined4)uVar5;
    *(undefined4 *)((long)addr + uVar5 * 4) = uVar3;
    uVar4 = uVar5 + 1;
    for (lVar8 = (long)colptr[uVar5]; lVar8 < colptr[uVar4]; lVar8 = lVar8 + 1) {
      if (uVar5 != *(uint *)((long)addr + (long)rowind[lVar8] * 4)) {
        *(undefined4 *)((long)addr + (long)rowind[lVar8] * 4) = uVar3;
        iVar7 = iVar7 + 1;
      }
    }
    for (lVar8 = (long)(int)addr_00[uVar5]; lVar8 < (int)addr_00[uVar4]; lVar8 = lVar8 + 1) {
      lVar9 = (long)*(int *)((long)addr_01 + lVar8 * 4);
      if (uVar5 != *(uint *)((long)addr + lVar9 * 4)) {
        *(undefined4 *)((long)addr + lVar9 * 4) = uVar3;
        iVar7 = iVar7 + 1;
      }
    }
  }
  *bnz = iVar7;
  piVar6 = (int_t *)superlu_malloc(size);
  *b_colptr = piVar6;
  if (piVar6 != (int_t *)0x0) {
    if ((long)*bnz != 0) {
      piVar6 = (int_t *)superlu_malloc((long)*bnz << 2);
      *b_rowind = piVar6;
      if (piVar6 == (int_t *)0x0) {
        sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for b_rowind[]",0x169,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
               );
        superlu_abort_and_exit(local_138);
      }
    }
    for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
      *(undefined4 *)((long)addr + uVar4 * 4) = 0xffffffff;
    }
    piVar6 = *b_colptr;
    iVar7 = 0;
    uVar4 = 0;
    while (uVar5 = uVar4, uVar5 != uVar10) {
      piVar6[uVar5] = iVar7;
      uVar3 = (undefined4)uVar5;
      *(undefined4 *)((long)addr + uVar5 * 4) = uVar3;
      uVar4 = uVar5 + 1;
      for (lVar8 = (long)colptr[uVar5]; lVar8 < colptr[uVar4]; lVar8 = lVar8 + 1) {
        iVar2 = rowind[lVar8];
        if (uVar5 != *(uint *)((long)addr + (long)iVar2 * 4)) {
          *(undefined4 *)((long)addr + (long)iVar2 * 4) = uVar3;
          lVar9 = (long)iVar7;
          iVar7 = iVar7 + 1;
          (*b_rowind)[lVar9] = iVar2;
        }
      }
      for (lVar8 = (long)(int)addr_00[uVar5]; lVar8 < (int)addr_00[uVar4]; lVar8 = lVar8 + 1) {
        iVar2 = *(int *)((long)addr_01 + lVar8 * 4);
        if (uVar5 != *(uint *)((long)addr + (long)iVar2 * 4)) {
          *(undefined4 *)((long)addr + (long)iVar2 * 4) = uVar3;
          lVar9 = (long)iVar7;
          iVar7 = iVar7 + 1;
          (*b_rowind)[lVar9] = iVar2;
        }
      }
    }
    piVar6[lVar11] = iVar7;
    superlu_free(addr);
    superlu_free(addr_00);
    superlu_free(addr_01);
    return;
  }
  sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for b_colptr[]",0x166,
          "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c");
  superlu_abort_and_exit(local_138);
}

Assistant:

void at_plus_a(const int n, const int_t nz, const int_t *colptr, const int_t *rowind,
               int_t *bnz, int_t **b_colptr, int_t **b_rowind)
{
    register int_t i, j, k, col, num_nz;
    int_t *t_colptr, *t_rowind; /* a column oriented form of T = A' */
    int_t *marker;

    if ( !(marker = (int_t*) SUPERLU_MALLOC( n * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for marker[]");
    if ( !(t_colptr = (int_t*) SUPERLU_MALLOC( (n+1) * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for t_colptr[]");
    if ( !(t_rowind = (int_t*) SUPERLU_MALLOC( nz * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails t_rowind[]");

    
    /* Get counts of each column of T, and set up column pointers */
    for (i = 0; i < n; ++i) marker[i] = 0;
    for (j = 0; j < n; ++j) {
	for (i = colptr[j]; i < colptr[j+1]; ++i)
	    ++marker[rowind[i]];
    }
    t_colptr[0] = 0;
    for (i = 0; i < n; ++i) {
	t_colptr[i+1] = t_colptr[i] + marker[i];
	marker[i] = t_colptr[i];
    }

    /* Transpose the matrix from A to T */
    for (j = 0; j < n; ++j)
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    col = rowind[i];
	    t_rowind[marker[col]] = j;
	    ++marker[col];
	}


    /* ----------------------------------------------------------------
       compute B = A + T, where column j of B is:

       Struct (B_*j) = Struct (A_*k) UNION Struct (T_*k)

       do not include the diagonal entry
       ---------------------------------------------------------------- */

    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;

    /* First pass determines number of nonzeros in B */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	/* Add pattern of column A_*k to B_*j */
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    k = rowind[i];
	    if ( marker[k] != j ) {
		marker[k] = j;
		++num_nz;
	    }
	}

	/* Add pattern of column T_*k to B_*j */
	for (i = t_colptr[j]; i < t_colptr[j+1]; ++i) {
	    k = t_rowind[i];
	    if ( marker[k] != j ) {
		marker[k] = j;
		++num_nz;
	    }
	}
    }
    *bnz = num_nz;
    
    /* Allocate storage for A+A' */
    if ( !(*b_colptr = (int_t*) SUPERLU_MALLOC( (n+1) * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for b_colptr[]");
    if ( *bnz) {
      if ( !(*b_rowind = (int_t*) SUPERLU_MALLOC( *bnz * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for b_rowind[]");
    }
    
    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;
    
    /* Compute each column of B, one at a time */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	(*b_colptr)[j] = num_nz;
	
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	/* Add pattern of column A_*k to B_*j */
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    k = rowind[i];
	    if ( marker[k] != j ) {
		marker[k] = j;
		(*b_rowind)[num_nz++] = k;
	    }
	}

	/* Add pattern of column T_*k to B_*j */
	for (i = t_colptr[j]; i < t_colptr[j+1]; ++i) {
	    k = t_rowind[i];
	    if ( marker[k] != j ) {
		marker[k] = j;
		(*b_rowind)[num_nz++] = k;
	    }
	}
    }
    (*b_colptr)[n] = num_nz;
       
    SUPERLU_FREE(marker);
    SUPERLU_FREE(t_colptr);
    SUPERLU_FREE(t_rowind);
}